

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

item<mpt::layout::graph::axis> * __thiscall
mpt::unique_array<mpt::item<mpt::layout::graph::axis>_>::insert
          (unique_array<mpt::item<mpt::layout::graph::axis>_> *this,long pos)

{
  content<mpt::item<mpt::layout::graph::axis>_> *pcVar1;
  buffer *this_00;
  type_traits *ptVar2;
  _func_int_void_ptr_void_ptr *p_Var3;
  bool bVar4;
  int iVar5;
  item<mpt::layout::graph::axis> *this_01;
  ulong uVar6;
  
  pcVar1 = (this->_ref)._ref;
  if (pcVar1 == (content<mpt::item<mpt::layout::graph::axis>_> *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (pcVar1->super_buffer)._used >> 5;
  }
  if (pos < 0) {
    pos = pos + uVar6;
    if (pos < 0) {
      return (item<mpt::layout::graph::axis> *)0x0;
    }
  }
  else if ((long)uVar6 <= pos) {
    uVar6 = pos;
  }
  bVar4 = reserve(this,uVar6 + 1);
  if (bVar4) {
    this_00 = &((this->_ref)._ref)->super_buffer;
    this_01 = (item<mpt::layout::graph::axis> *)buffer::insert(this_00,pos << 5,0x20);
    if (this_01 != (item<mpt::layout::graph::axis> *)0x0) {
      ptVar2 = this_00->_content_traits;
      if (((ptVar2 != (type_traits *)0x0) &&
          (p_Var3 = ptVar2->init, p_Var3 != (_func_int_void_ptr_void_ptr *)0x0)) &&
         (iVar5 = (*p_Var3)(this_01,(void *)0x0), -1 < iVar5)) {
        return this_01;
      }
      item<mpt::layout::graph::axis>::item(this_01,(axis *)0x0);
      return this_01;
    }
  }
  return (item<mpt::layout::graph::axis> *)0x0;
}

Assistant:

T *insert(long pos)
	{
		long len = length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!reserve(len + 1)) {
			return 0;
		}
		content<T> *d = _ref.instance();
		/* inserted raw data is NOT initialized */
		void *ptr = d->insert(pos);
		if (!ptr) {
			return 0;
		}
		const struct type_traits *traits = d->content_traits();
		if (traits && traits->init && traits->init(ptr, 0) >= 0) {
			return static_cast<T *>(ptr);
		}
		return new (ptr) T;
	}